

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondR.cpp
# Opt level: O2

void __thiscall
OpenMD::HBondR::HBondR
          (HBondR *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3,
          double rCut,RealType len,double thetaCut,int nrbins)

{
  SelectionEvaluator *this_00;
  pointer pdVar1;
  pointer piVar2;
  SelectionEvaluator *this_01;
  SelectionEvaluator *this_02;
  pointer pdVar3;
  pointer piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  SelectionManager *local_c8;
  SelectionManager *local_c0;
  SelectionManager *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  vector<int,_std::allocator<int>_> *local_a0;
  vector<int,_std::allocator<int>_> *local_98;
  SelectionEvaluator *local_90;
  SelectionEvaluator *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  RealType local_60;
  RealType local_58;
  string local_50;
  
  local_68 = filename;
  local_60 = rCut;
  local_58 = thetaCut;
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nrbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__HBondR_002ed8d0;
  local_70 = &this->selectionScript1_;
  std::__cxx11::string::string((string *)local_70,(string *)sele1);
  local_b8 = &this->seleMan1_;
  SelectionManager::SelectionManager(local_b8,info);
  local_88 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(local_88,info);
  local_78 = &this->selectionScript2_;
  std::__cxx11::string::string((string *)local_78,(string *)sele2);
  local_c0 = &this->seleMan2_;
  SelectionManager::SelectionManager(local_c0,info);
  local_90 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(local_90,info);
  local_80 = &this->selectionScript3_;
  std::__cxx11::string::string((string *)local_80,(string *)sele3);
  local_c8 = &this->seleMan3_;
  SelectionManager::SelectionManager(local_c8,info);
  this_00 = &this->evaluator3_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  this_02 = local_88;
  this_01 = local_90;
  this->len_ = len;
  this->nBins_ = nrbins;
  local_a8 = &this->sliceQ_;
  local_b0 = &this->sliceCount_;
  local_98 = &this->nDonor_;
  local_a0 = &this->nAcceptor_;
  (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->nHBonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nHBonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nHBonds_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->nDonor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nDonor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->nDonor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->nAcceptor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->nAcceptor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->nAcceptor_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->ff_ = ((this->super_StaticAnalyser).info_)->forceField_;
  SelectionEvaluator::loadScriptString(local_88,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_e8,this_02);
    SelectionManager::setSelectionSet(local_b8,(SelectionSet *)&local_e8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_e8);
  }
  SelectionEvaluator::loadScriptString(this_01,sele2);
  if ((this->evaluator2_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_e8,this_01);
    SelectionManager::setSelectionSet(local_c0,(SelectionSet *)&local_e8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_e8);
  }
  SelectionEvaluator::loadScriptString(this_00,sele3);
  if ((this->evaluator3_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)&local_e8,this_00);
    SelectionManager::setSelectionSet(local_c8,(SelectionSet *)&local_e8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_e8);
  }
  this->rCut_ = local_60;
  this->thetaCut_ = local_58;
  this->deltaR_ = this->len_ / (double)this->nBins_;
  this->nBins_ = nrbins;
  std::vector<int,_std::allocator<int>_>::resize(&this->nHBonds_,(long)nrbins);
  std::vector<int,_std::allocator<int>_>::resize(local_98,(long)this->nBins_);
  std::vector<int,_std::allocator<int>_>::resize(local_a0,(long)this->nBins_);
  std::vector<double,_std::allocator<double>_>::resize(local_a8,(long)this->nBins_);
  std::vector<int,_std::allocator<int>_>::resize(local_b0,(long)this->nBins_);
  pdVar1 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    *pdVar3 = 0.0;
  }
  piVar2 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar4 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start; piVar4 != piVar2; piVar4 = piVar4 + 1) {
    *piVar4 = 0;
  }
  getPrefix(&local_50,local_68);
  std::operator+(&local_e8,&local_50,".hbondr");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

HBondR::HBondR(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 const std::string& sele3, double rCut, RealType len,
                 double thetaCut, int nrbins) :
      StaticAnalyser(info, filename, nrbins),
      selectionScript1_(sele1), seleMan1_(info), evaluator1_(info),
      selectionScript2_(sele2), seleMan2_(info), evaluator2_(info),
      selectionScript3_(sele3), seleMan3_(info), evaluator3_(info), len_(len),
      nBins_(nrbins) {
    ff_ = info_->getForceField();

    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }
    evaluator2_.loadScriptString(sele2);
    if (!evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
    }
    evaluator3_.loadScriptString(sele3);
    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    // Set up cutoff values:

    rCut_     = rCut;
    thetaCut_ = thetaCut;
    deltaR_   = len_ / nBins_;
    nBins_    = nrbins;
    // fixed number of bins

    nHBonds_.resize(nBins_);
    nDonor_.resize(nBins_);
    nAcceptor_.resize(nBins_);
    sliceQ_.resize(nBins_);
    sliceCount_.resize(nBins_);
    std::fill(sliceQ_.begin(), sliceQ_.end(), 0.0);
    std::fill(sliceCount_.begin(), sliceCount_.end(), 0);

    setOutputName(getPrefix(filename) + ".hbondr");
  }